

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

cmFileLockResult __thiscall cmFileLockPool::Release(cmFileLockPool *this,string *filename)

{
  bool bVar1;
  reference pSVar2;
  cmFileLockResult cVar3;
  ScopePool *fileScope;
  iterator __end1_1;
  iterator __begin1_1;
  List *__range1_1;
  ScopePool *funcScope;
  iterator __end1;
  iterator __begin1;
  List *__range1;
  string *filename_local;
  cmFileLockPool *this_local;
  cmFileLockResult result;
  
  __end1 = std::vector<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>::begin
                     (&this->FunctionScopes);
  funcScope = (ScopePool *)
              std::vector<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>::
              end(&this->FunctionScopes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmFileLockPool::ScopePool_*,_std::vector<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>_>
                                     *)&funcScope), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<cmFileLockPool::ScopePool_*,_std::vector<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>_>
             ::operator*(&__end1);
    this_local = (cmFileLockPool *)ScopePool::Release(pSVar2,filename);
    bVar1 = cmFileLockResult::IsOk((cmFileLockResult *)&this_local);
    if (!bVar1) {
      return (cmFileLockResult)this_local;
    }
    __gnu_cxx::
    __normal_iterator<cmFileLockPool::ScopePool_*,_std::vector<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>::
             begin(&this->FileScopes);
  fileScope = (ScopePool *)
              std::vector<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>::
              end(&this->FileScopes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<cmFileLockPool::ScopePool_*,_std::vector<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>_>
                        *)&fileScope);
    if (!bVar1) {
      cVar3 = ScopePool::Release(&this->ProcessScope,filename);
      return cVar3;
    }
    pSVar2 = __gnu_cxx::
             __normal_iterator<cmFileLockPool::ScopePool_*,_std::vector<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>_>
             ::operator*(&__end1_1);
    this_local = (cmFileLockPool *)ScopePool::Release(pSVar2,filename);
    bVar1 = cmFileLockResult::IsOk((cmFileLockResult *)&this_local);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<cmFileLockPool::ScopePool_*,_std::vector<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>_>
    ::operator++(&__end1_1);
  }
  return (cmFileLockResult)this_local;
}

Assistant:

cmFileLockResult cmFileLockPool::Release(const std::string& filename)
{
  for (auto& funcScope : this->FunctionScopes) {
    const cmFileLockResult result = funcScope.Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  for (auto& fileScope : this->FileScopes) {
    const cmFileLockResult result = fileScope.Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  return this->ProcessScope.Release(filename);
}